

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.h
# Opt level: O0

uint get_alignment_bits(MemOp memop)

{
  undefined4 local_10;
  uint a;
  MemOp memop_local;
  
  local_10 = memop & MO_ALIGN;
  if (local_10 == MO_8) {
    local_10 = MO_8;
  }
  else if (local_10 == MO_ALIGN) {
    local_10 = memop & MO_64;
  }
  else {
    local_10 = local_10 >> 4;
  }
  return local_10;
}

Assistant:

static inline unsigned get_alignment_bits(MemOp memop)
{
    unsigned a = memop & MO_AMASK;

    if (a == MO_UNALN) {
        /* No alignment required.  */
        a = 0;
    } else if (a == MO_ALIGN) {
        /* A natural alignment requirement.  */
        a = memop & MO_SIZE;
    } else {
        /* A specific alignment requirement.  */
        a = a >> MO_ASHIFT;
    }

    /* The requested alignment cannot overlap the TLB flags.  */
    tcg_debug_assert((TLB_FLAGS_MASK & ((1 << a) - 1)) == 0);

    return a;
}